

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefileCall::~cmMakefileCall(cmMakefileCall *this)

{
  cmListFileBacktrace local_30;
  cmMakefileCall *local_10;
  cmMakefileCall *this_local;
  
  local_10 = this;
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::pop_back
            (&this->Makefile->ExecutionStatusStack);
  cmListFileBacktrace::Pop(&local_30,&this->Makefile->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&local_30);
  cmListFileBacktrace::~cmListFileBacktrace(&local_30);
  return;
}

Assistant:

~cmMakefileCall()
  {
    this->Makefile->ExecutionStatusStack.pop_back();
    this->Makefile->Backtrace = this->Makefile->Backtrace.Pop();
  }